

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,true>
               (DecimalCastData<int> *state)

{
  uint uVar1;
  bool bVar2;
  ExponentType EVar3;
  uint8_t uVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  uint uVar15;
  uint uVar18;
  uint uVar19;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar20;
  uint uVar21;
  
  EVar3 = state->exponent_type;
  if ((EVar3 != POSITIVE) &&
     (uVar4 = state->decimal_count - state->scale,
     state->scale <= state->decimal_count && uVar4 != '\0')) {
    state->excessive_decimals = uVar4;
  }
  if (state->excessive_decimals != '\0') {
    bVar2 = TruncateExcessiveDecimals<duckdb::DecimalCastData<int>,true>(state);
    if (!bVar2) {
      return false;
    }
    EVar3 = state->exponent_type;
  }
  if (((EVar3 == NONE) && (state->round_set == true)) && (state->should_round == true)) {
    state->result = state->result + -1;
  }
  uVar10 = state->result;
  if (state->decimal_count < state->scale) {
    bVar7 = state->scale + ~state->decimal_count;
    auVar14._1_3_ = 0;
    auVar14[0] = bVar7;
    auVar14[4] = bVar7;
    auVar14._5_3_ = 0;
    auVar14[8] = bVar7;
    auVar14._9_3_ = 0;
    auVar14[0xc] = bVar7;
    auVar14._13_3_ = 0;
    uVar15 = 1;
    uVar1 = 1;
    uVar21 = 1;
    iVar5 = 4;
    do {
      uVar13 = uVar21;
      uVar12 = uVar1;
      uVar11 = uVar15;
      uVar9 = uVar10;
      uVar10 = uVar9 * 10;
      uVar1 = uVar12 * 10;
      auVar17._4_4_ = uVar11;
      auVar17._0_4_ = uVar11;
      auVar17._8_4_ = uVar13;
      auVar17._12_4_ = uVar13;
      uVar21 = (uint)((auVar17._8_8_ & 0xffffffff) * 10);
      iVar6 = iVar5 + -4;
      iVar8 = iVar5 + (bVar7 + 4 & 0xfffffffc);
      uVar15 = uVar11 * 10;
      iVar5 = iVar6;
    } while (iVar8 != 8);
    iVar6 = -iVar6;
    auVar16._4_4_ = iVar6;
    auVar16._0_4_ = iVar6;
    auVar16._8_4_ = iVar6;
    auVar16._12_4_ = iVar6;
    auVar14 = auVar14 | _DAT_012acff0;
    auVar17 = (auVar16 | ram0x01326210) ^ _DAT_012acff0;
    uVar15 = -(uint)(auVar14._0_4_ < auVar17._0_4_);
    uVar18 = -(uint)(auVar14._4_4_ < auVar17._4_4_);
    uVar19 = -(uint)(auVar14._8_4_ < auVar17._8_4_);
    uVar20 = -(uint)(auVar14._12_4_ < auVar17._12_4_);
    uVar10 = (~uVar19 & uVar1 | uVar12 & uVar19) * (~uVar15 & uVar10 | uVar9 & uVar15) *
             (~uVar18 & uVar11 * 10 | uVar11 & uVar18) * (~uVar20 & uVar21 | uVar13 & uVar20);
    state->result = uVar10;
  }
  uVar1 = -state->limit;
  return uVar10 != uVar1 && SBORROW4(uVar10,uVar1) == (int)(uVar10 + state->limit) < 0;
}

Assistant:

static bool Finalize(T &state) {
		if (state.exponent_type != ExponentType::POSITIVE && state.decimal_count > state.scale) {
			//! Did not encounter an exponent, but ALLOW_EXPONENT was on
			state.excessive_decimals = state.decimal_count - state.scale;
		}
		if (state.excessive_decimals && !TruncateExcessiveDecimals<T, NEGATIVE>(state)) {
			return false;
		}
		if (state.exponent_type == ExponentType::NONE && state.round_set && state.should_round) {
			RoundUpResult<T, NEGATIVE>(state);
		}
		//  if we have not gotten exactly "scale" decimals, we need to multiply the result
		//  e.g. if we have a string "1.0" that is cast to a DECIMAL(9,3), the value needs to be 1000
		//  but we have only gotten the value "10" so far, so we multiply by 1000
		for (uint8_t i = state.decimal_count; i < state.scale; i++) {
			state.result *= 10;
		}
		if (NEGATIVE) {
			return state.result > -state.limit;
		} else {
			return state.result < state.limit;
		}
	}